

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_istype(jit_State *J,RecordFFData *rd)

{
  long in_RDI;
  cTValue *in_stack_00000088;
  TRef in_stack_00000094;
  jit_State *in_stack_00000098;
  
  argv2ctype(in_stack_00000098,in_stack_00000094,in_stack_00000088);
  if ((*(uint *)(*(long *)(in_RDI + 0x88) + 4) & 0x1f000000) == 0xa000000) {
    argv2ctype(in_stack_00000098,in_stack_00000094,in_stack_00000088);
    *(undefined4 *)(in_RDI + 0x164) = 4;
    **(undefined4 **)(in_RDI + 0x88) = 0x2007ffd;
  }
  else {
    **(undefined4 **)(in_RDI + 0x88) = 0x1007ffe;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_istype(jit_State *J, RecordFFData *rd)
{
  argv2ctype(J, J->base[0], &rd->argv[0]);
  if (tref_iscdata(J->base[1])) {
    argv2ctype(J, J->base[1], &rd->argv[1]);
    J->postproc = LJ_POST_FIXBOOL;
    J->base[0] = TREF_TRUE;
  } else {
    J->base[0] = TREF_FALSE;
  }
}